

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioStream.c
# Opt level: O2

UINT8 AudioDrv_Init(UINT32 drvID,void **retDrvStruct)

{
  AUDIO_DRV *pAVar1;
  UINT8 UVar2;
  undefined2 uVar3;
  UINT32 UVar4;
  UINT32 UVar5;
  UINT8 UVar6;
  void *in_RAX;
  long lVar7;
  AUDIO_OPTS *pAVar8;
  ADRV_LOAD *pAVar9;
  ADRV_INSTANCE *pAVar10;
  void *drvData;
  void *local_28;
  
  UVar6 = '!';
  if (drvID < audDrvCount) {
    UVar6 = '\"';
    if ((audDrvLoaded[drvID].flags & 1) != 0) {
      pAVar9 = audDrvLoaded + drvID;
      pAVar1 = pAVar9->drvStruct;
      local_28 = in_RAX;
      if ((audDrvLoaded[drvID].flags & 2) == 0) {
        UVar6 = (*pAVar1->Init)();
        if (UVar6 != '\0') {
          return UVar6;
        }
        pAVar9->flags = pAVar9->flags | 2;
      }
      UVar6 = (*pAVar1->Create)(&local_28);
      if (UVar6 == '\0') {
        if (runDevCount == '\x01') {
          pAVar10 = runDevices;
          for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
            if (pAVar10->ID == 0xffffffff) {
              pAVar10->ID = (UINT32)lVar7;
              goto LAB_00110067;
            }
            pAVar10 = pAVar10 + 1;
          }
        }
        pAVar10 = (ADRV_INSTANCE *)0x0;
LAB_00110067:
        pAVar10->drvStruct = pAVar1;
        pAVar8 = (*pAVar1->GetDefOpts)();
        UVar6 = pAVar8->numChannels;
        UVar2 = pAVar8->numBitsPerSmpl;
        uVar3 = *(undefined2 *)&pAVar8->field_0x6;
        UVar4 = pAVar8->usecPerBuf;
        UVar5 = pAVar8->numBuffers;
        (pAVar10->drvOpts).sampleRate = pAVar8->sampleRate;
        (pAVar10->drvOpts).numChannels = UVar6;
        (pAVar10->drvOpts).numBitsPerSmpl = UVar2;
        *(undefined2 *)&(pAVar10->drvOpts).field_0x6 = uVar3;
        (pAVar10->drvOpts).usecPerBuf = UVar4;
        (pAVar10->drvOpts).numBuffers = UVar5;
        pAVar10->drvData = local_28;
        pAVar10->userParam = (void *)0x0;
        pAVar10->mainCallback = (AUDFUNC_FILLBUF)0x0;
        pAVar10->forwardDrvs = (ADRV_LIST *)0x0;
        pAVar10->hMutex = (OS_MUTEX *)0x0;
        UVar6 = '\0';
        OSMutex_Init(&pAVar10->hMutex,'\0');
        *retDrvStruct = pAVar10;
      }
    }
  }
  return UVar6;
}

Assistant:

UINT8 AudioDrv_Init(UINT32 drvID, void** retDrvStruct)
{
	ADRV_LOAD* tempDLoad;
	AUDIO_DRV* tempDrv;
	ADRV_INSTANCE* audInst;
	void* drvData;
	UINT8 retVal;
	
	if (drvID >= audDrvCount)
		return AERR_INVALID_DRV;
	tempDLoad = &audDrvLoaded[drvID];
	if (! (tempDLoad->flags & ADFLG_ENABLE))
		return AERR_DRV_DISABLED;
	
	tempDrv = tempDLoad->drvStruct;
	if (! (tempDLoad->flags & ADFLG_IS_INIT))
	{
		retVal = tempDrv->Init();
		if (retVal)
			return retVal;
		tempDLoad->flags |= ADFLG_IS_INIT;
	}
	
	retVal = tempDrv->Create(&drvData);
	if (retVal)
		return retVal;
	audInst = GetFreeRunSlot();
	audInst->drvStruct = tempDrv;
	audInst->drvOpts = *tempDrv->GetDefOpts();
	audInst->drvData = drvData;
	audInst->userParam = NULL;
	audInst->mainCallback = NULL;
	audInst->forwardDrvs = NULL;
	audInst->hMutex = NULL;
	OSMutex_Init(&audInst->hMutex, 0);
	*retDrvStruct = (void*)audInst;
	
	return AERR_OK;
}